

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator
          (cmGlobalWatcomWMakeGenerator *this,cmake *cm)

{
  cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
            (&this->super_cmGlobalUnixMakefileGenerator3,cm);
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_005fa340;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                     FindMakeProgramFile,0,
             (char *)(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                     FindMakeProgramFile._M_string_length,0x501200);
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.ToolSupportsColor = true;
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.NeedSymbolicMark = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmGlobalUnixMakefileGenerator3).EmptyRuleHackCommand,0,
             (char *)(this->super_cmGlobalUnixMakefileGenerator3).EmptyRuleHackCommand.
                     _M_string_length,0x501215);
  cmState::SetWatcomWMake(cm->State,true);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmGlobalUnixMakefileGenerator3).IncludeDirective,0,
             (char *)(this->super_cmGlobalUnixMakefileGenerator3).IncludeDirective._M_string_length,
             0x50121b);
  (this->super_cmGlobalUnixMakefileGenerator3).DefineWindowsNULL = true;
  (this->super_cmGlobalUnixMakefileGenerator3).UnixCD = false;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                     MakeSilentFlag,0,
             (char *)(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
                     MakeSilentFlag._M_string_length,0x501224);
  return;
}

Assistant:

cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator(cmake* cm)
  : cmGlobalUnixMakefileGenerator3(cm)
{
  this->FindMakeProgramFile = "CMakeFindWMake.cmake";
#ifdef _WIN32
  this->ForceUnixPaths = false;
#endif
  this->ToolSupportsColor = true;
  this->NeedSymbolicMark = true;
  this->EmptyRuleHackCommand = "@cd .";
#ifdef _WIN32
  cm->GetState()->SetWindowsShell(true);
#endif
  cm->GetState()->SetWatcomWMake(true);
  this->IncludeDirective = "!include";
  this->DefineWindowsNULL = true;
  this->UnixCD = false;
  this->MakeSilentFlag = "-h";
}